

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O2

bool __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::grant_ownership
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,
          color_quad<unsigned_char,_int> *pPixels,uint width,uint height,uint pitch,uint flags)

{
  bool bVar1;
  uint size;
  
  if (pitch == 0xffffffff) {
    pitch = width;
  }
  if ((width <= pitch &&
       (height != 0 && (width != 0 && pPixels != (color_quad<unsigned_char,_int> *)0x0))) &&
     (this->m_pPixels != pPixels)) {
    clear(this);
    size = pitch * height;
    bVar1 = vector<crnlib::color_quad<unsigned_char,_int>_>::grant_ownership
                      (&this->m_pixel_buf,pPixels,size,size);
    if (bVar1) {
      this->m_pPixels = pPixels;
      this->m_width = width;
      this->m_height = height;
      this->m_pitch = pitch;
      this->m_total = size;
      this->m_comp_flags = flags;
      return true;
    }
  }
  return false;
}

Assistant:

bool grant_ownership(color_type* pPixels, uint width, uint height, uint pitch = UINT_MAX, uint flags = pixel_format_helpers::cDefaultCompFlags) {
    if (pitch == UINT_MAX)
      pitch = width;

    if ((!pPixels) || (!width) || (!height) || (pitch < width)) {
      CRNLIB_ASSERT(0);
      return false;
    }

    if (pPixels == get_ptr()) {
      CRNLIB_ASSERT(0);
      return false;
    }

    clear();

    if (!m_pixel_buf.grant_ownership(pPixels, height * pitch, height * pitch))
      return false;

    m_pPixels = pPixels;

    m_width = width;
    m_height = height;
    m_pitch = pitch;
    m_total = pitch * height;
    m_comp_flags = flags;

    return true;
  }